

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O1

void __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
::clear(BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
        *this)

{
  pointer ppVar1;
  pointer ppVar2;
  int iVar3;
  pointer ppVar4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_pullLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  ppVar1 = (this->pullElements).
           super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->pullElements).
           super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = ppVar1;
  if (ppVar2 != ppVar1) {
    do {
      helics::ActionMessage::~ActionMessage(&ppVar4->second);
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar2);
    (this->pullElements).
    super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  ppVar1 = (this->pushElements).
           super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->pushElements).
           super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = ppVar1;
  if (ppVar2 != ppVar1) {
    do {
      helics::ActionMessage::~ActionMessage(&ppVar4->second);
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar2);
    (this->pushElements).
    super__Vector_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  if ((this->priorityQueue).c.
      super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->priorityQueue).c.
      super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ::pop_front(&(this->priorityQueue).c);
    } while ((this->priorityQueue).c.
             super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->priorityQueue).c.
             super__Deque_base<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  LOCK();
  (this->queueEmptyFlag)._M_base._M_i = true;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
  return;
}

Assistant:

void clear()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pullElements.clear();
            pushElements.clear();
            while (!priorityQueue.empty()) {
                priorityQueue.pop();
            }
            queueEmptyFlag = true;
        }